

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O0

charconv * CharConvOpen(tchar_t *From,tchar_t *To)

{
  int iVar1;
  iconv_t CC;
  tchar_t *To_local;
  tchar_t *From_local;
  
  GetDefault();
  if ((From == (tchar_t *)0x0) || (To_local = From, *From == '\0')) {
    To_local = Current;
  }
  if ((To == (tchar_t *)0x0) || (CC = To, *To == '\0')) {
    CC = Current;
  }
  iVar1 = tcsicmp((tchar_t *)CC,To_local);
  if (iVar1 == 0) {
    From_local = (tchar_t *)0x0;
  }
  else {
    From_local = (tchar_t *)iconv_open((char *)CC,To_local);
    if (From_local == (tchar_t *)0xffffffffffffffff) {
      From_local = (tchar_t *)0x0;
    }
  }
  return (charconv *)From_local;
}

Assistant:

charconv* CharConvOpen(const tchar_t* From, const tchar_t* To)
{
    iconv_t CC;

    GetDefault();

    if (!From || !From[0])
        From = Current;

    if (!To || !To[0])
        To = Current;

    if (tcsicmp(To,From)==0)
        return NULL;

    CC = iconv_open(To,From);
    if (CC == (iconv_t)-1)
        return NULL;

    return (charconv*)CC;
}